

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall gimage::BasicImageIO::saveProperties(BasicImageIO *this,Properties *prop,char *name)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_RDX;
  size_t pos;
  string s;
  char *in_stack_00000180;
  char *in_stack_00000188;
  Properties *in_stack_00000190;
  allocator local_99;
  string local_98 [32];
  string local_78 [32];
  ulong local_58;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  
  local_18 = in_RDX;
  bVar3 = gutil::Properties::isEmpty((Properties *)0x179c2c);
  pcVar2 = local_18;
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar2,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    local_58 = std::__cxx11::string::find((char)local_38,0x3a);
    if (local_58 != 0xffffffffffffffff) {
      iVar4 = std::__cxx11::string::compare((ulong)local_38,local_58,(char *)0x2);
      if (iVar4 == 0) {
        local_58 = 0xffffffffffffffff;
      }
    }
    if (local_58 == 0xffffffffffffffff) {
      local_58 = std::__cxx11::string::rfind((char)local_38,0x2e);
    }
    uVar1 = local_58;
    if (local_58 == 0xffffffffffffffff) {
      std::__cxx11::string::append((char *)local_38);
    }
    else {
      lVar5 = std::__cxx11::string::size();
      std::__cxx11::string::replace((ulong)local_38,uVar1,(char *)(lVar5 - local_58));
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,local_18,&local_99);
    std::operator+(local_18,__rhs);
    std::__cxx11::string::c_str();
    gutil::Properties::save(in_stack_00000190,in_stack_00000188,in_stack_00000180);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void BasicImageIO::saveProperties(const gutil::Properties &prop, const char *name) const
{
  if (!prop.isEmpty())
  {
    std::string s=name;
    size_t pos;

    pos=s.find(':');

    if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
    {
      pos=s.npos;
    }

    if (pos == s.npos)
    {
      pos=s.rfind('.');
    }

    if (pos != s.npos)
    {
      s.replace(pos, s.size()-pos, ".hdr");
    }
    else
    {
      s.append(".hdr");
    }

    prop.save(s.c_str(), ("Properties of image "+std::string(name)).c_str());
  }
}